

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw::predict(vw *this,example *ec)

{
  undefined8 uVar1;
  example *in_RDI;
  stringstream __msg;
  size_t in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188;
  learner<char,_char> *in_stack_ffffffffffffffe0;
  
  if (((uint)(in_RDI->super_example_predict).feature_space[0].values._end[0x3a] & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(&local_188,"This reduction does not support single-line examples.");
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               in_stack_fffffffffffffe38);
    __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  LEARNER::as_singleline<char,char>(in_stack_ffffffffffffffe0);
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
             ,in_RDI,in_stack_fffffffffffffe20);
  return;
}

Assistant:

void vw::predict(example& ec)
{
  if (l->is_multiline)
    THROW("This reduction does not support single-line examples.");

  LEARNER::as_singleline(l)->predict(ec);
}